

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Opnd * __thiscall
Lowerer::LoadOptimizationOverridesValueOpnd
          (Lowerer *this,Instr *instr,OptimizationOverridesValue valueType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  intptr_t pMemLoc;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MemRefOpnd *pMVar4;
  undefined4 *puVar5;
  Func *func;
  IRType type;
  undefined4 extraout_var;
  
  switch(valueType) {
  case OptimizationOverridesArraySetElementFastPathVtable:
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x13])();
    pMemLoc = CONCAT44(extraout_var,iVar3);
    break;
  case OptimizationOverridesIntArraySetElementFastPathVtable:
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x14])();
    pMemLoc = CONCAT44(extraout_var_02,iVar3);
    break;
  case OptimizationOverridesFloatArraySetElementFastPathVtable:
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x15])();
    pMemLoc = CONCAT44(extraout_var_00,iVar3);
    break;
  case OptimizationOverridesSideEffects:
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x12])();
    pMemLoc = CONCAT44(extraout_var_01,iVar3);
    func = instr->m_func;
    type = TyInt32;
    goto LAB_005c8b50;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xcb6,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    return (Opnd *)0x0;
  }
  func = instr->m_func;
  type = TyUint64;
LAB_005c8b50:
  pMVar4 = IR::MemRefOpnd::New(pMemLoc,type,func,AddrOpndKindDynamicMisc);
  return &pMVar4->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadOptimizationOverridesValueOpnd(IR::Instr *instr, OptimizationOverridesValue valueType)
{
    switch (valueType)
    {
    case OptimizationOverridesValue::OptimizationOverridesSideEffects:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetSideEffectsAddr(), TyInt32, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesIntArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesFloatArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetFloatArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}